

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

int __thiscall MeCab::Viterbi::open(Viterbi *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined7 extraout_var;
  DictionaryInfo *pDVar6;
  undefined7 extraout_var_00;
  Connector *pCVar7;
  undefined7 extraout_var_01;
  ulong uVar8;
  size_t sVar9;
  wlog *pwVar10;
  undefined7 extraout_var_02;
  int __oflag_00;
  int __oflag_01;
  char *in_stack_00000020;
  Param *in_stack_00000028;
  whatlog *in_stack_ffffffffffffff68;
  wlog *in_stack_ffffffffffffff70;
  Tokenizer<mecab_node_t,_mecab_path_t> *in_stack_ffffffffffffff78;
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_> *in_stack_ffffffffffffff80;
  wlog local_48;
  wlog local_40;
  wlog local_38;
  wlog local_30 [3];
  char *local_18;
  Viterbi *local_10;
  bool local_1;
  
  local_18 = __file;
  local_10 = this;
  pTVar3 = (Tokenizer<mecab_node_t,_mecab_path_t> *)operator_new(0x678);
  Tokenizer<mecab_node_t,_mecab_path_t>::Tokenizer(pTVar3);
  scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::reset
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pTVar3 = scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->(&this->tokenizer_);
  uVar1 = Tokenizer<mecab_node_t,_mecab_path_t>::open(pTVar3,local_18,__oflag_00);
  if ((uVar1 & 1) == 0) {
    wlog::wlog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    poVar4 = std::operator<<((ostream *)&this->what_,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x32);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"tokenizer_->open(param)");
    poVar4 = std::operator<<(poVar4,"] ");
    scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->(&this->tokenizer_);
    pcVar5 = Tokenizer<mecab_node_t,_mecab_path_t>::what
                       ((Tokenizer<mecab_node_t,_mecab_path_t> *)0x1be33a);
    poVar4 = std::operator<<(poVar4,pcVar5);
    local_1 = wlog::operator&(local_30,poVar4);
    this = (Viterbi *)CONCAT71(extraout_var,local_1);
  }
  else {
    pTVar3 = scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                       (&this->tokenizer_);
    pDVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info(pTVar3);
    if (pDVar6 == (DictionaryInfo *)0x0) {
      wlog::wlog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      poVar4 = std::operator<<((ostream *)&this->what_,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x33);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"tokenizer_->dictionary_info()");
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"Dictionary is empty");
      local_1 = wlog::operator&(&local_38,poVar4);
      this = (Viterbi *)CONCAT71(extraout_var_00,local_1);
    }
    else {
      pCVar7 = (Connector *)operator_new(0x1c0);
      Connector::Connector(pCVar7);
      scoped_ptr<MeCab::Connector>::reset
                ((scoped_ptr<MeCab::Connector> *)in_stack_ffffffffffffff80,
                 (Connector *)in_stack_ffffffffffffff78);
      pCVar7 = scoped_ptr<MeCab::Connector>::operator->(&this->connector_);
      uVar1 = Connector::open(pCVar7,local_18,__oflag_01);
      if ((uVar1 & 1) == 0) {
        wlog::wlog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        poVar4 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x36);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,"connector_->open(param)");
        poVar4 = std::operator<<(poVar4,"] ");
        scoped_ptr<MeCab::Connector>::operator->(&this->connector_);
        pcVar5 = Connector::what((Connector *)0x1be529);
        poVar4 = std::operator<<(poVar4,pcVar5);
        local_1 = wlog::operator&(&local_40,poVar4);
        this = (Viterbi *)CONCAT71(extraout_var_01,local_1);
      }
      else {
        pTVar3 = scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                           (&this->tokenizer_);
        pDVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info(pTVar3);
        uVar8 = (ulong)pDVar6->lsize;
        pCVar7 = scoped_ptr<MeCab::Connector>::operator->(&this->connector_);
        sVar9 = Connector::left_size(pCVar7);
        if (uVar8 == sVar9) {
          pTVar3 = scoped_ptr<MeCab::Tokenizer<mecab_node_t,_mecab_path_t>_>::operator->
                             (&this->tokenizer_);
          pDVar6 = Tokenizer<mecab_node_t,_mecab_path_t>::dictionary_info(pTVar3);
          in_stack_ffffffffffffff70 = (wlog *)(ulong)pDVar6->rsize;
          pCVar7 = scoped_ptr<MeCab::Connector>::operator->(&this->connector_);
          pwVar10 = (wlog *)Connector::right_size(pCVar7);
          if (in_stack_ffffffffffffff70 == pwVar10) {
            iVar2 = Param::get<int>(in_stack_00000028,in_stack_00000020);
            this->cost_factor_ = iVar2;
            if (this->cost_factor_ == 0) {
              this->cost_factor_ = 800;
            }
            local_1 = true;
            goto LAB_001be6a8;
          }
        }
        wlog::wlog(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        poVar4 = std::operator<<((ostream *)&this->what_,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/viterbi.cpp"
                                );
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x3b);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,
                                 "tokenizer_->dictionary_info()->lsize == connector_->left_size() && tokenizer_->dictionary_info()->rsize == connector_->right_size()"
                                );
        poVar4 = std::operator<<(poVar4,"] ");
        poVar4 = std::operator<<(poVar4,"Transition table and dictionary are not compatible");
        local_1 = wlog::operator&(&local_48,poVar4);
        this = (Viterbi *)CONCAT71(extraout_var_02,local_1);
      }
    }
  }
LAB_001be6a8:
  return (int)CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool Viterbi::open(const Param &param) {
  tokenizer_.reset(new Tokenizer<Node, Path>);
  CHECK_FALSE(tokenizer_->open(param)) << tokenizer_->what();
  CHECK_FALSE(tokenizer_->dictionary_info()) << "Dictionary is empty";

  connector_.reset(new Connector);
  CHECK_FALSE(connector_->open(param)) << connector_->what();

  CHECK_FALSE(tokenizer_->dictionary_info()->lsize ==
              connector_->left_size() &&
              tokenizer_->dictionary_info()->rsize ==
              connector_->right_size())
      << "Transition table and dictionary are not compatible";

  cost_factor_ = param.get<int>("cost-factor");
  if (cost_factor_ == 0) {
    cost_factor_ = 800;
  }

  return true;
}